

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_decoding.cc
# Opt level: O0

bool draco::DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<5>>
               (uint32_t num_values,DecoderBuffer *src_buffer,uint32_t *out_values)

{
  bool bVar1;
  uint32_t uVar2;
  long in_RDX;
  uint in_EDI;
  uint32_t value;
  uint32_t i;
  RAnsSymbolDecoder<5> decoder;
  RAnsSymbolDecoder<5> *this;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint uVar3;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  DecoderBuffer *in_stack_ffffffffffffffa0;
  RAnsSymbolDecoder<5> *in_stack_ffffffffffffffa8;
  bool local_1;
  
  this = (RAnsSymbolDecoder<5> *)&stack0xffffffffffffff88;
  RAnsSymbolDecoder<5>::RAnsSymbolDecoder
            ((RAnsSymbolDecoder<5> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  bVar1 = RAnsSymbolDecoder<5>::Create(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  if (bVar1) {
    if (in_EDI != 0) {
      uVar2 = RAnsSymbolDecoder<5>::num_symbols((RAnsSymbolDecoder<5> *)&stack0xffffffffffffff88);
      if (uVar2 == 0) {
        local_1 = false;
        goto LAB_001fbd0a;
      }
    }
    bVar1 = RAnsSymbolDecoder<5>::StartDecoding
                      ((RAnsSymbolDecoder<5> *)
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                       (DecoderBuffer *)
                       CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    if (bVar1) {
      for (uVar3 = 0; uVar3 < in_EDI; uVar3 = uVar3 + 1) {
        uVar2 = RAnsSymbolDecoder<5>::DecodeSymbol((RAnsSymbolDecoder<5> *)0x1fbcc2);
        *(uint32_t *)(in_RDX + (ulong)uVar3 * 4) = uVar2;
      }
      RAnsSymbolDecoder<5>::EndDecoding((RAnsSymbolDecoder<5> *)0x1fbcf8);
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
LAB_001fbd0a:
  RAnsSymbolDecoder<5>::~RAnsSymbolDecoder(this);
  return local_1;
}

Assistant:

bool DecodeRawSymbolsInternal(uint32_t num_values, DecoderBuffer *src_buffer,
                              uint32_t *out_values) {
  SymbolDecoderT decoder;
  if (!decoder.Create(src_buffer)) {
    return false;
  }

  if (num_values > 0 && decoder.num_symbols() == 0) {
    return false;  // Wrong number of symbols.
  }

  if (!decoder.StartDecoding(src_buffer)) {
    return false;
  }
  for (uint32_t i = 0; i < num_values; ++i) {
    // Decode a symbol into the value.
    const uint32_t value = decoder.DecodeSymbol();
    out_values[i] = value;
  }
  decoder.EndDecoding();
  return true;
}